

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O2

void __thiscall ConditionalEstimator::~ConditionalEstimator(ConditionalEstimator *this)

{
  double *pdVar1;
  int i;
  long lVar2;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ConditionalEstimator_001547a8;
  if (this->condSamples != (double *)0x0) {
    operator_delete__(this->condSamples);
  }
  if (this->aOne != (double *)0x0) {
    operator_delete__(this->aOne);
  }
  if (this->aTwo != (double *)0x0) {
    operator_delete__(this->aTwo);
  }
  if ((this->aThree != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  if (this->aEvents != (double *)0x0) {
    operator_delete__(this->aEvents);
  }
  if (this->aDist != (double **)0x0) {
    for (lVar2 = 0; lVar2 <= (long)this->nPost + (long)this->nPre; lVar2 = lVar2 + 1) {
      pdVar1 = this->aDist[lVar2];
      if (pdVar1 != (double *)0x0) {
        operator_delete__(pdVar1);
      }
    }
    operator_delete(this->aDist,8);
  }
  Ring<double>::~Ring(&this->condConditionRing);
  Ring<bool>::~Ring(&this->condEventRing);
  Ring<double>::~Ring(&this->condSampleRing);
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

ConditionalEstimator::~ConditionalEstimator()
{
	if(condSamples) delete[] condSamples;
	if(aOne) delete[] aOne;
	if(aTwo) delete[] aTwo;
	if(aThree) delete[] aTwo;
	if(aEvents) delete[] aEvents;
	if(aDist) {
		for(int i=0; i<nPre+nPost+1; i++)
			delete[] aDist[i];
		delete aDist;
	}
}